

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslOpMap.cpp
# Opt level: O2

TOperator glslang::HlslOpMap::postUnary(EHlslTokenClass op)

{
  TOperator TVar1;
  
  if (op == EHTokIncOp) {
    TVar1 = EOpPostIncrement;
  }
  else if (op == EHTokDecOp) {
    TVar1 = EOpPostDecrement;
  }
  else if (op == EHTokColonColon) {
    TVar1 = EOpScoping;
  }
  else if (op == EHTokDot) {
    TVar1 = EOpIndexDirectStruct;
  }
  else {
    if (op != EHTokLeftBracket) {
      return EOpNull;
    }
    TVar1 = EOpIndexIndirect;
  }
  return TVar1;
}

Assistant:

TOperator HlslOpMap::postUnary(EHlslTokenClass op)
{
    switch (op) {
    case EHTokDot:         return EOpIndexDirectStruct;
    case EHTokLeftBracket: return EOpIndexIndirect;

    case EHTokIncOp:       return EOpPostIncrement;
    case EHTokDecOp:       return EOpPostDecrement;

    case EHTokColonColon:  return EOpScoping;

    default:               return EOpNull;             // means not a post-unary op
    }
}